

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.cpp
# Opt level: O0

bool __thiscall YAML::Emitter::SetMapFormat(Emitter *this,EMITTER_MANIP value)

{
  bool bVar1;
  EMITTER_MANIP in_ESI;
  EmitterState *in_RDI;
  EMITTER_MANIP unaff_retaddr;
  value unaff_retaddr_00;
  undefined4 in_stack_00000008;
  bool ok;
  uint3 in_stack_fffffffffffffff0;
  value scope;
  byte bVar2;
  
  scope = (value)in_stack_fffffffffffffff0;
  std::unique_ptr<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_>::operator->
            ((unique_ptr<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_> *)0xef7120);
  bVar1 = EmitterState::SetFlowType
                    ((EmitterState *)CONCAT44(value,in_stack_00000008),unaff_retaddr_00,
                     unaff_retaddr,(value)((ulong)in_RDI >> 0x20));
  if (bVar1) {
    scope = CONCAT13(1,(int3)scope);
  }
  std::unique_ptr<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_>::operator->
            ((unique_ptr<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_> *)0xef714a);
  bVar1 = EmitterState::SetMapKeyFormat(in_RDI,in_ESI,scope);
  bVar2 = (byte)(scope >> 0x18);
  if (bVar1) {
    bVar2 = 1;
  }
  return (bool)(bVar2 & 1);
}

Assistant:

bool Emitter::SetMapFormat(EMITTER_MANIP value) {
  bool ok = false;
  if (m_pState->SetFlowType(GroupType::Map, value, FmtScope::Global))
    ok = true;
  if (m_pState->SetMapKeyFormat(value, FmtScope::Global))
    ok = true;
  return ok;
}